

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O3

ByteData * __thiscall
cfd::TransactionContext::CreateSignatureHash
          (ByteData *__return_storage_ptr__,TransactionContext *this,OutPoint *outpoint,
          Script *redeem_script,SigHashType *sighash_type,Amount *value,WitnessVersion version)

{
  undefined4 uVar1;
  ByteData256 sighash;
  void *local_70 [3];
  void *local_58 [3];
  SigHashType local_3c [12];
  
  uVar1 = (**(code **)(*(long *)this + 0x78))(this,outpoint);
  cfd::core::Script::GetData();
  cfd::core::SigHashType::SigHashType(local_3c,sighash_type);
  cfd::core::Transaction::GetSignatureHash(local_58,this,uVar1,local_70,local_3c,value,version);
  if (local_70[0] != (void *)0x0) {
    operator_delete(local_70[0]);
  }
  cfd::core::ByteData256::GetBytes();
  cfd::core::ByteData::ByteData(__return_storage_ptr__,(vector *)local_70);
  if (local_70[0] != (void *)0x0) {
    operator_delete(local_70[0]);
  }
  if (local_58[0] != (void *)0x0) {
    operator_delete(local_58[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData TransactionContext::CreateSignatureHash(
    const OutPoint& outpoint, const Script& redeem_script,
    SigHashType sighash_type, const Amount& value,
    WitnessVersion version) const {
  // TODO(k-matsuzawa): For now, when using OP_CODESEPARATOR, divide it on the user side and ask them to specify only the applicable part.  // NOLINT
  ByteData256 sighash = GetSignatureHash(
      GetTxInIndex(outpoint), redeem_script.GetData(), sighash_type, value,
      version);
  return ByteData(sighash.GetBytes());
}